

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O1

int32_t __thiscall
charls::default_traits<unsigned_char,_unsigned_char>::modulo_range
          (default_traits<unsigned_char,_unsigned_char> *this,int32_t error_value)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = -error_value;
  if (0 < error_value) {
    iVar2 = error_value;
  }
  uVar1 = this->range;
  if ((int)uVar1 < iVar2) {
    __assert_fail("std::abs(error_value) <= range",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/test/../src/default_traits.h"
                  ,0x61,
                  "int32_t charls::default_traits<unsigned char, unsigned char>::modulo_range(int32_t) const [SampleType = unsigned char, PixelType = unsigned char]"
                 );
  }
  iVar2 = (error_value >> 0x1f & uVar1) + error_value;
  iVar3 = (int)((uVar1 - ((int)(uVar1 + 1) >> 0x1f)) + 1) >> 1;
  uVar4 = 0;
  if (iVar3 <= iVar2) {
    uVar4 = uVar1;
  }
  iVar2 = iVar2 - uVar4;
  if ((-((int)uVar1 / 2) <= iVar2) && (iVar2 < iVar3)) {
    return iVar2;
  }
  __assert_fail("-range / 2 <= error_value && error_value <= ((range + 1) / 2) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/test/../src/default_traits.h"
                ,0x6d,
                "int32_t charls::default_traits<unsigned char, unsigned char>::modulo_range(int32_t) const [SampleType = unsigned char, PixelType = unsigned char]"
               );
}

Assistant:

FORCE_INLINE int32_t modulo_range(int32_t error_value) const noexcept
    {
        ASSERT(std::abs(error_value) <= range);

        if (error_value < 0)
        {
            error_value += range;
        }

        if (error_value >= (range + 1) / 2)
        {
            error_value -= range;
        }

        ASSERT(-range / 2 <= error_value && error_value <= ((range + 1) / 2) - 1);
        return error_value;
    }